

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O2

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::plus_equal_column(Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
                    *this,Column *target,A_ds_type *other,Arith_element w)

{
  uint uVar1;
  node_ptr plVar2;
  A_ds_type *pAVar3;
  Element EVar4;
  node_ptr next;
  pointer pPVar5;
  pointer ppVar6;
  pointer ppVar7;
  node_ptr plVar8;
  node_ptr plVar9;
  Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
  *this_00;
  Arith_element local_7c;
  A_ds_type *local_78;
  Field_Zp *local_70;
  Persistent_cohomology_cell<unsigned_int,_int> local_68;
  
  plVar9 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.next_;
  ppVar7 = (other->
           super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_70 = &this->coeff_field_;
  this_00 = &this->cell_pool_;
  local_7c = w;
  local_78 = other;
  do {
    pAVar3 = local_78;
    ppVar6 = (local_78->
             super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    plVar8 = plVar9;
    while( true ) {
      if ((plVar8 == (node_ptr)&target->col_) || (ppVar7 == ppVar6)) {
        for (; ppVar7 != ppVar6; ppVar7 = ppVar7 + 1) {
          local_68.key_ = ppVar7->first;
          local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)0x0;
          local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
               (node_ptr)0x0;
          local_68.coefficient_ = 0;
          local_68.self_col_ = target;
          pPVar5 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                   ::
                   construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                             ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                               *)this_00,&local_68);
          if (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
              (node_ptr)0x0) {
            (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->
            next_ = local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.
                    next_;
            (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->
            prev_ = local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.
                    prev_;
          }
          EVar4 = Field_Zp::plus_times_equal
                            (local_70,&pPVar5->coefficient_,&ppVar7->second,&local_7c);
          pPVar5->coefficient_ = EVar4;
          plVar9 = (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_;
          (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ =
               plVar9;
          (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ =
               (node_ptr)&target->col_;
          (target->col_).super_type.data_.root_plus_size_.m_header.super_node.prev_ =
               (node_ptr)&pPVar5->super_base_hook_cam_v;
          plVar9->next_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
          ppVar6 = (pAVar3->
                   super__Vector_base<std::pair<unsigned_int,_int>,_std::allocator<std::pair<unsigned_int,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        }
        return;
      }
      uVar1 = ppVar7->first;
      if (uVar1 <= *(uint *)&plVar8[1].next_) break;
      plVar8 = plVar8->next_;
    }
    if (uVar1 < *(uint *)&plVar8[1].next_) {
      local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)0x0;
      local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_ =
           (node_ptr)0x0;
      local_68.coefficient_ = 0;
      local_68.key_ = uVar1;
      local_68.self_col_ = target;
      pPVar5 = Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
               ::
               construct<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                         ((Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,int>>
                           *)this_00,&local_68);
      if (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_)->next_
             = local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_;
        (local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.next_)->prev_
             = local_68.super_base_hook_cam_h.super_type.super_type.super_list_node<void_*>.prev_;
      }
      EVar4 = Field_Zp::plus_times_equal(local_70,&pPVar5->coefficient_,&ppVar7->second,&local_7c);
      pPVar5->coefficient_ = EVar4;
      plVar9 = plVar8->prev_;
      (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.prev_ = plVar9;
      (pPVar5->super_base_hook_cam_v).super_type.super_type.super_list_node<void_*>.next_ = plVar8;
      plVar8->prev_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
      plVar9->next_ = (node_ptr)&pPVar5->super_base_hook_cam_v;
      plVar9 = plVar8;
    }
    else {
      EVar4 = Field_Zp::plus_times_equal
                        (local_70,(Element *)((long)&plVar8[1].next_ + 4),&ppVar7->second,&local_7c)
      ;
      *(Element *)((long)&plVar8[1].next_ + 4) = EVar4;
      plVar9 = plVar8->next_;
      if (EVar4 == 0) {
        plVar2 = plVar8->prev_;
        plVar2->next_ = plVar9;
        plVar9->prev_ = plVar2;
        Simple_object_pool<Gudhi::persistent_cohomology::Persistent_cohomology_cell<unsigned_int,_int>_>
        ::destroy(this_00,(pointer)(plVar8 + -1));
      }
    }
    ppVar7 = ppVar7 + 1;
  } while( true );
}

Assistant:

void plus_equal_column(Column & target, A_ds_type const& other  // value_type is pair<Simplex_key,Arith_element>
                         , Arith_element w) {
    auto target_it = target.col_.begin();
    auto other_it = other.begin();
    while (target_it != target.col_.end() && other_it != other.end()) {
      if (target_it->key_ < other_it->first) {
        ++target_it;
      } else {
        if (target_it->key_ > other_it->first) {
          Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first   // key
              , coeff_field_.additive_identity(), &target));

          cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);

          target.col_.insert(target_it, *cell_tmp);

          ++other_it;
        } else {  // it1->key == it2->key
          // target_it->coefficient_ <- target_it->coefficient_ + other_it->second * w
          target_it->coefficient_ = coeff_field_.plus_times_equal(target_it->coefficient_, other_it->second, w);
          if (target_it->coefficient_ == coeff_field_.additive_identity()) {
            auto tmp_it = target_it;
            ++target_it;
            ++other_it;   // iterators remain valid
            Cell * tmp_cell_ptr = &(*tmp_it);
            target.col_.erase(tmp_it);  // removed from column

            cell_pool_.destroy(tmp_cell_ptr);  // delete from memory
          } else {
            ++target_it;
            ++other_it;
          }
        }
      }
    }
    while (other_it != other.end()) {
      Cell * cell_tmp = cell_pool_.construct(Cell(other_it->first, coeff_field_.additive_identity(), &target));
      cell_tmp->coefficient_ = coeff_field_.plus_times_equal(cell_tmp->coefficient_, other_it->second, w);
      target.col_.insert(target.col_.end(), *cell_tmp);

      ++other_it;
    }
  }